

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convert_to_sampled_image_pass.cpp
# Opt level: O0

bool __thiscall
spvtools::opt::ConvertToSampledImagePass::IsSamplerOfSampledImageDecoratedByDescriptorSetBinding
          (ConvertToSampledImagePass *this,Instruction *sampled_image_inst,
          DescriptorSetAndBinding *descriptor_set_binding)

{
  bool bVar1;
  uint32_t uVar2;
  Op OVar3;
  IRContext *this_00;
  DefUseManager *this_01;
  Instruction *this_02;
  bool local_59;
  DescriptorSetAndBinding local_50;
  DescriptorSetAndBinding sampler_descriptor_set_binding;
  Instruction *sampler;
  Instruction *sampler_load;
  uint32_t sampler_id;
  DefUseManager *def_use_mgr;
  DescriptorSetAndBinding *descriptor_set_binding_local;
  Instruction *sampled_image_inst_local;
  ConvertToSampledImagePass *this_local;
  
  this_00 = Pass::context(&this->super_Pass);
  this_01 = IRContext::get_def_use_mgr(this_00);
  uVar2 = Instruction::GetSingleWordInOperand(sampled_image_inst,1);
  this_02 = analysis::DefUseManager::GetDef(this_01,uVar2);
  OVar3 = Instruction::opcode(this_02);
  if (OVar3 == OpLoad) {
    uVar2 = Instruction::GetSingleWordInOperand(this_02,0);
    sampler_descriptor_set_binding =
         (DescriptorSetAndBinding)analysis::DefUseManager::GetDef(this_01,uVar2);
    bVar1 = GetDescriptorSetBinding(this,(Instruction *)sampler_descriptor_set_binding,&local_50);
    local_59 = false;
    if (bVar1) {
      local_59 = DescriptorSetAndBinding::operator==(&local_50,descriptor_set_binding);
    }
    this_local._7_1_ = local_59;
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool ConvertToSampledImagePass::
    IsSamplerOfSampledImageDecoratedByDescriptorSetBinding(
        Instruction* sampled_image_inst,
        const DescriptorSetAndBinding& descriptor_set_binding) {
  auto* def_use_mgr = context()->get_def_use_mgr();
  uint32_t sampler_id = sampled_image_inst->GetSingleWordInOperand(1u);
  auto* sampler_load = def_use_mgr->GetDef(sampler_id);
  if (sampler_load->opcode() != spv::Op::OpLoad) return false;
  auto* sampler = def_use_mgr->GetDef(sampler_load->GetSingleWordInOperand(0u));
  DescriptorSetAndBinding sampler_descriptor_set_binding;
  return GetDescriptorSetBinding(*sampler, &sampler_descriptor_set_binding) &&
         sampler_descriptor_set_binding == descriptor_set_binding;
}